

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.cc
# Opt level: O2

string * __thiscall
duckdb_re2::CEscape_abi_cxx11_(string *__return_storage_ptr__,duckdb_re2 *this,StringPiece *src)

{
  ulong uVar1;
  char cVar2;
  long lVar3;
  void *pvVar4;
  ulong uVar5;
  ulong uVar6;
  char *pcVar7;
  char *pcVar8;
  
  lVar3 = *(long *)(this + 8);
  uVar1 = lVar3 * 4 + 1;
  pvVar4 = operator_new__(uVar1);
  pcVar7 = *(char **)this;
  pcVar8 = pcVar7 + lVar3;
  uVar6 = 0;
  do {
    if (pcVar8 <= pcVar7) {
      uVar5 = 0xffffffffffffffff;
      if (uVar1 != uVar6) {
        *(undefined1 *)((long)pvVar4 + uVar6) = 0;
        uVar5 = uVar6;
      }
LAB_01b1ee6c:
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)__return_storage_ptr__,pvVar4,(long)pvVar4 + uVar5);
      operator_delete__(pvVar4);
      return __return_storage_ptr__;
    }
    if (uVar1 - uVar6 < 2) {
LAB_01b1ee57:
      uVar5 = 0xffffffffffffffff;
      goto LAB_01b1ee6c;
    }
    cVar2 = *pcVar7;
    if (cVar2 == '\t') {
      *(undefined2 *)((long)pvVar4 + uVar6) = 0x745c;
LAB_01b1ee42:
      uVar6 = uVar6 + 2;
    }
    else {
      if (cVar2 == '\\') {
        *(undefined2 *)((long)pvVar4 + uVar6) = 0x5c5c;
        goto LAB_01b1ee42;
      }
      if (cVar2 == '\r') {
        *(undefined2 *)((long)pvVar4 + uVar6) = 0x725c;
        goto LAB_01b1ee42;
      }
      if (cVar2 == '\"') {
        *(undefined2 *)((long)pvVar4 + uVar6) = 0x225c;
        goto LAB_01b1ee42;
      }
      if (cVar2 == '\'') {
        *(undefined2 *)((long)pvVar4 + uVar6) = 0x275c;
        goto LAB_01b1ee42;
      }
      if (cVar2 == '\n') {
        *(undefined2 *)((long)pvVar4 + uVar6) = 0x6e5c;
        goto LAB_01b1ee42;
      }
      if ((byte)(cVar2 + 0x81U) < 0xa1) {
        if (uVar1 - uVar6 < 5) goto LAB_01b1ee57;
        snprintf((char *)((long)pvVar4 + uVar6),5,"\\%03o");
        uVar6 = uVar6 + 4;
      }
      else {
        *(char *)((long)pvVar4 + uVar6) = cVar2;
        uVar6 = uVar6 + 1;
      }
    }
    pcVar7 = pcVar7 + 1;
  } while( true );
}

Assistant:

std::string CEscape(const StringPiece& src) {
  const size_t dest_len = src.size() * 4 + 1; // Maximum possible expansion
  char* dest = new char[dest_len];
  const size_t used = CEscapeString(src.data(), src.size(),
                                    dest, dest_len);
  std::string s = std::string(dest, used);
  delete[] dest;
  return s;
}